

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

ScriptPtr * __thiscall FBehavior::FindScript(FBehavior *this,int script)

{
  ScriptPtr *pSVar1;
  
  pSVar1 = BinarySearch<ScriptPtr,int>(this->Scripts,this->NumScripts,0,script);
  if ((this->Scripts < pSVar1) && (pSVar1[-1].Number == script)) {
    pSVar1 = pSVar1 + -1;
  }
  return pSVar1;
}

Assistant:

const ScriptPtr *FBehavior::FindScript (int script) const
{
	const ScriptPtr *ptr = BinarySearch<ScriptPtr, int>
		((ScriptPtr *)Scripts, NumScripts, &ScriptPtr::Number, script);

	// If the preceding script has the same number, return it instead.
	// See the note by the script sorting above for why.
	if (ptr > Scripts)
	{
		if (ptr[-1].Number == script)
		{
			ptr--;
		}
	}
	return ptr;
}